

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcts.h
# Opt level: O0

void __thiscall
MCTS::Node<NimState>::Node(Node<NimState> *this,TestGame *state,Move *move_,Node<NimState> *parent_)

{
  undefined8 in_RCX;
  undefined4 *in_RDX;
  undefined4 *in_RSI;
  undefined4 *in_RDI;
  
  *in_RDI = *in_RDX;
  *(undefined8 *)(in_RDI + 2) = in_RCX;
  in_RDI[4] = *in_RSI;
  *(undefined8 *)(in_RDI + 6) = 0;
  in_RDI[8] = 0;
  NimState::get_moves(state);
  std::vector<MCTS::Node<NimState>_*,_std::allocator<MCTS::Node<NimState>_*>_>::vector
            ((vector<MCTS::Node<NimState>_*,_std::allocator<MCTS::Node<NimState>_*>_> *)0x1e3877);
  *(undefined8 *)(in_RDI + 0x16) = 0;
  return;
}

Assistant:

Node<State>::Node(const State& state, const Move& move_, Node* parent_) :
	move(move_),
	parent(parent_),
	player_to_move(state.player_to_move),
	wins(0),
	visits(0),
	moves(state.get_moves()),
	UCT_score(0)
{ }